

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotorSpeed::IntFromDescriptor
          (ChShaftsMotorSpeed *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  Scalar SVar1;
  Scalar SVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
  local_38 [24];
  
  SVar1 = (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,(ulong)off_L);
  *pSVar3 = SVar1;
  ChVariables::Get_qb((ChVectorRef *)local_38,&(this->variable).super_ChVariables);
  pSVar4 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,0,0);
  SVar2 = *pSVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)v,(ulong)off_v);
  *pSVar3 = SVar2;
  return;
}

Assistant:

void ChShaftsMotorSpeed::IntFromDescriptor(const unsigned int off_v,  // offset in v
                                      ChStateDelta& v,
                                      const unsigned int off_L,  // offset in L
                                      ChVectorDynamic<>& L) {
    L(off_L) = constraint.Get_l_i();

    v(off_v) = this->variable.Get_qb()(0, 0);
}